

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void checkProgress(IntegrityCk *pCheck)

{
  sqlite3 *psVar1;
  int iVar2;
  sqlite3 *db;
  IntegrityCk *pCheck_local;
  
  psVar1 = pCheck->db;
  if ((psVar1->u1).isInterrupted != 0) {
    pCheck->rc = 9;
    pCheck->nErr = pCheck->nErr + 1;
    pCheck->mxErr = 0;
  }
  if (((psVar1->xProgress != (_func_int_void_ptr *)0x0) &&
      (pCheck->nStep = pCheck->nStep + 1, pCheck->nStep % psVar1->nProgressOps == 0)) &&
     (iVar2 = (*psVar1->xProgress)(psVar1->pProgressArg), iVar2 != 0)) {
    pCheck->rc = 9;
    pCheck->nErr = pCheck->nErr + 1;
    pCheck->mxErr = 0;
  }
  return;
}

Assistant:

static void checkProgress(IntegrityCk *pCheck){
  sqlite3 *db = pCheck->db;
  if( AtomicLoad(&db->u1.isInterrupted) ){
    pCheck->rc = SQLITE_INTERRUPT;
    pCheck->nErr++;
    pCheck->mxErr = 0;
  }
#ifndef SQLITE_OMIT_PROGRESS_CALLBACK
  if( db->xProgress ){
    assert( db->nProgressOps>0 );
    pCheck->nStep++;
    if( (pCheck->nStep % db->nProgressOps)==0
     && db->xProgress(db->pProgressArg)
    ){
      pCheck->rc = SQLITE_INTERRUPT;
      pCheck->nErr++;
      pCheck->mxErr = 0;
    }
  }
#endif
}